

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_hasReturnValue_Test::testBody
          (TEST_MockReturnValueTest_hasReturnValue_Test *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  UtestShell *pUVar4;
  MockSupport *pMVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SimpleString SStack_38;
  SimpleString local_28;
  
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar5->_vptr_MockSupport[7])(pMVar5);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK","!mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2a,pTVar6);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  (*pMVar5->_vptr_MockSupport[3])(pMVar5,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar2 = (*pMVar5->_vptr_MockSupport[6])(pMVar5,&local_28);
  bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xa0))
                    ((long *)CONCAT44(extraout_var,iVar2));
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(bVar1 ^ 1),"CHECK","!mock().actualCall(\"foo\").hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2c,pTVar6);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar5->_vptr_MockSupport[7])(pMVar5);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK","!mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2d,pTVar6);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo2");
  iVar2 = (*pMVar5->_vptr_MockSupport[3])(pMVar5,&local_28);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 200))
            ((long *)CONCAT44(extraout_var_00,iVar2),1);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo2");
  iVar2 = (*pMVar5->_vptr_MockSupport[6])(pMVar5,&local_28);
  bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xa0))
                    ((long *)CONCAT44(extraout_var_01,iVar2));
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar1,"CHECK","mock().actualCall(\"foo2\").hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x30,pTVar6);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar5 = mock(&SStack_38,(MockFailureReporter *)0x0);
  uVar3 = (*pMVar5->_vptr_MockSupport[7])(pMVar5);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 & 0xff),"CHECK","mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x31,pTVar6);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockReturnValueTest, hasReturnValue)
{
    CHECK(!mock().hasReturnValue());
    mock().expectOneCall("foo");
    CHECK(!mock().actualCall("foo").hasReturnValue());
    CHECK(!mock().hasReturnValue());

    mock().expectOneCall("foo2").andReturnValue(1);
    CHECK(mock().actualCall("foo2").hasReturnValue());
    CHECK(mock().hasReturnValue());
}